

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_type_and_names_match(nifti_image *nim,int show_warn)

{
  char **ppcVar1;
  uint uVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar6;
  size_t extraout_RDX_01;
  size_t extraout_RDX_02;
  size_t extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t extraout_RDX_05;
  int iVar7;
  int iVar8;
  char func [27];
  char local_58 [40];
  
  builtin_strncpy(local_58 + 0x10,"ames_match",0xb);
  builtin_strncpy(local_58,"nifti_type_and_n",0x10);
  if (nim == (nifti_image *)0x0) {
    iVar7 = -1;
    if (show_warn != 0) {
      fprintf(_stderr,"** %s: missing nifti_image\n",local_58);
    }
  }
  else {
    iVar8 = 0;
    if ((nim->fname == (char *)0x0) && (iVar8 = 1, show_warn != 0)) {
      fprintf(_stderr,"** %s: missing header filename\n",local_58);
    }
    if (nim->iname == (char *)0x0) {
      if (show_warn != 0) {
        fprintf(_stderr,"** %s: missing image filename\n",local_58);
      }
      iVar8 = iVar8 + 1;
    }
    if ((3 < (uint)nim->nifti_type) && (iVar8 = 1, show_warn != 0)) {
      fprintf(_stderr,"** %s: bad nifti_type %d\n",local_58);
    }
    iVar7 = -1;
    if (iVar8 == 0) {
      ppcVar1 = &nim->fname;
      pcVar4 = nifti_find_file_extension(*ppcVar1);
      pcVar5 = nifti_find_file_extension(nim->iname);
      bVar3 = false;
      sVar6 = extraout_RDX;
      if ((pcVar4 == (char *)0x0) && (bVar3 = true, show_warn != 0)) {
        nifti_type_and_names_match_cold_1();
        sVar6 = extraout_RDX_02;
      }
      if ((pcVar5 == (char *)0x0) && (bVar3 = true, show_warn != 0)) {
        nifti_type_and_names_match_cold_2();
        sVar6 = extraout_RDX_03;
      }
      iVar7 = 0;
      if (!bVar3) {
        uVar2 = nim->nifti_type;
        iVar7 = 1;
        if ((uVar2 == 0) || (uVar2 == 2)) {
          iVar8 = fileext_n_compare(pcVar4,".hdr",sVar6);
          sVar6 = extraout_RDX_01;
          if ((show_warn != 0) && (iVar8 != 0)) {
            fprintf(_stderr,"-d no \'.hdr\' extension, but NIFTI type is %d, %s\n",(ulong)uVar2,
                    *ppcVar1);
            sVar6 = extraout_RDX_04;
          }
          iVar8 = fileext_n_compare(pcVar5,".img",sVar6);
          if ((show_warn != 0) && (iVar8 != 0)) {
            fprintf(_stderr,"-d no \'.img\' extension, but NIFTI type is %d, %s\n",
                    (ulong)(uint)nim->nifti_type,nim->iname);
          }
        }
        else if (uVar2 == 1) {
          iVar8 = fileext_n_compare(pcVar4,".nii",sVar6);
          sVar6 = extraout_RDX_00;
          if ((show_warn != 0) && (iVar8 != 0)) {
            nifti_type_and_names_match_cold_3();
            sVar6 = extraout_RDX_05;
          }
          iVar8 = fileext_n_compare(pcVar5,".nii",sVar6);
          if ((show_warn != 0) && (iVar8 != 0)) {
            nifti_type_and_names_match_cold_4();
          }
          pcVar4 = *ppcVar1;
          pcVar5 = nim->iname;
          iVar8 = strcmp(pcVar4,pcVar5);
          if ((show_warn != 0) && (iVar8 != 0)) {
            fprintf(_stderr,"-d NIFTI_FTYPE 1, but header and image filenames differ: %s, %s\n",
                    pcVar4,pcVar5);
          }
        }
      }
    }
  }
  return iVar7;
}

Assistant:

int nifti_type_and_names_match( nifti_image * nim, int show_warn )
{
   char func[] = "nifti_type_and_names_match";
   const char * ext_h;  /* header  filename extension */
   const char * ext_i;  /* image filename extension */
   int  errs = 0;          /* error counter */

   /* sanity checks */
   if( !nim ){
      if( show_warn ) fprintf(stderr,"** %s: missing nifti_image\n", func);
      return -1;
   }
   if( !nim->fname ){
      if( show_warn ) fprintf(stderr,"** %s: missing header filename\n", func);
      errs++;
   }
   if( !nim->iname ){
      if( show_warn ) fprintf(stderr,"** %s: missing image filename\n", func);
      errs++;
   }
   if( !is_valid_nifti_type(nim->nifti_type) ){
      if( show_warn )
         fprintf(stderr,"** %s: bad nifti_type %d\n", func, nim->nifti_type);
      errs++;
   }

   if( errs ) return -1;   /* then do not proceed */

   /* get pointers to extensions */
   ext_h = nifti_find_file_extension( nim->fname );
   ext_i = nifti_find_file_extension( nim->iname );

   /* check for filename extensions */
   if( !ext_h ){
      if( show_warn )
         fprintf(stderr,"-d missing NIFTI extension in header filename, %s\n",
                 nim->fname);
      errs++;
   }
   if( !ext_i ){
      if( show_warn )
         fprintf(stderr,"-d missing NIFTI extension in image filename, %s\n",
                 nim->iname);
      errs++;
   }

   if( errs ) return 0;   /* do not proceed, but this is just a mis-match */

   /* general tests */
   if( nim->nifti_type == NIFTI_FTYPE_NIFTI1_1 ){  /* .nii */
      if( fileext_n_compare(ext_h,".nii",4) ) {
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but no .nii extension in header filename, %s\n",
            nim->fname);
         errs++;
      }
      if( fileext_n_compare(ext_i,".nii",4) ) {
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but no .nii extension in image filename, %s\n",
            nim->iname);
         errs++;
      }
      if( strcmp(nim->fname, nim->iname) != 0 ){
         if( show_warn )
            fprintf(stderr,
            "-d NIFTI_FTYPE 1, but header and image filenames differ: %s, %s\n",
            nim->fname, nim->iname);
         errs++;
      }
   }
   else if( (nim->nifti_type == NIFTI_FTYPE_NIFTI1_2) || /* .hdr/.img */
            (nim->nifti_type == NIFTI_FTYPE_ANALYZE) )
   {
      if( fileext_n_compare(ext_h,".hdr",4) != 0 ){
         if( show_warn )
            fprintf(stderr,"-d no '.hdr' extension, but NIFTI type is %d, %s\n",
                    nim->nifti_type, nim->fname);
         errs++;
      }
      if( fileext_n_compare(ext_i,".img",4) != 0 ){
         if( show_warn )
            fprintf(stderr,"-d no '.img' extension, but NIFTI type is %d, %s\n",
                    nim->nifti_type, nim->iname);
         errs++;
      }
   }
   /* ignore any other nifti_type */

   return 1;
}